

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index,int tier,BITSTREAM_PROFILE profile)

{
  BITSTREAM_PROFILE in_DL;
  int in_ESI;
  byte in_DIL;
  double dVar1;
  
  dVar1 = get_max_bitrate(av1_level_defs + in_DIL,in_ESI,in_DL);
  return dVar1;
}

Assistant:

double av1_get_max_bitrate_for_level(AV1_LEVEL level_index, int tier,
                                     BITSTREAM_PROFILE profile) {
  assert(is_valid_seq_level_idx(level_index));
  return get_max_bitrate(&av1_level_defs[level_index], tier, profile);
}